

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printPKHLSLShiftImm(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  uint uVar2;
  MCOperand *op;
  ulong uVar3;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint Imm;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  uVar3 = MCOperand_getImm(op);
  uVar2 = (uint)uVar3;
  if (uVar2 != 0) {
    if (uVar2 < 10) {
      SStream_concat(in_RDX,", lsl #%u",uVar3 & 0xffffffff);
    }
    else {
      SStream_concat(in_RDX,", lsl #0x%x",uVar3 & 0xffffffff);
    }
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar1 = in_RDI->flat_insn->detail->groups +
               (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x39;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x3d) =
           uVar2;
    }
  }
  return;
}

Assistant:

static void printPKHLSLShiftImm(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Imm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	if (Imm == 0)
		return;
	//assert(Imm > 0 && Imm < 32 && "Invalid PKH shift immediate value!");
	if (Imm > HEX_THRESHOLD)
		SStream_concat(O, ", lsl #0x%x", Imm);
	else
		SStream_concat(O, ", lsl #%u", Imm);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_LSL;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = Imm;
	}
}